

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int * __thiscall fmt::v11::detail::allocator<int>::allocate(allocator<int> *this,size_t n)

{
  int *piVar1;
  undefined8 *puVar2;
  
  if (n >> 0x3e != 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format.h"
                ,0x2ea,"");
  }
  piVar1 = (int *)malloc(n << 2);
  if (piVar1 != (int *)0x0) {
    return piVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__throw_system_error;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

T* allocate(size_t n) {
    FMT_ASSERT(n <= max_value<size_t>() / sizeof(T), "");
    T* p = static_cast<T*>(malloc(n * sizeof(T)));
    if (!p) FMT_THROW(std::bad_alloc());
    return p;
  }